

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateUnindexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  ValueLength VVar3;
  Exception *this_00;
  unsigned_long uVar4;
  char *msg;
  uint8_t *ptr_00;
  size_t length_00;
  ulong uVar5;
  ValueLength VVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  uint8_t *local_40;
  uint8_t *local_38;
  
  VVar6 = 1L << (*ptr - 2 & 0x3f);
  validateBufferLength(this,VVar6 + 2,length,true);
  uVar1 = readIntegerNonEmpty<unsigned_long>(ptr + 1,VVar6);
  if (length < uVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array length is out of bounds";
  }
  else {
    uVar7 = VVar6 + 1;
    uVar2 = 9;
    if ((long)uVar1 < 9) {
      uVar2 = uVar1;
    }
    uVar4 = uVar7;
    uVar8 = uVar7;
    if ((long)uVar7 < (long)uVar2) {
      uVar8 = uVar2;
    }
    for (; (uVar9 = uVar8, (long)uVar4 < (long)uVar2 && (uVar9 = uVar4, ptr[uVar4] == '\0'));
        uVar4 = uVar4 + 1) {
    }
    uVar5 = uVar1 - uVar9;
    if (uVar5 == 0 || (long)uVar1 < (long)uVar9) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array structure is invalid";
    }
    else if (uVar9 == 9 || uVar9 == uVar7) {
      validatePart(this,ptr + uVar9,length - uVar9,true);
      local_40 = ptr + uVar9;
      VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_40);
      if (VVar6 == 0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array itemSize value is invalid";
      }
      else if (uVar5 < VVar6) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array nrItems value is invalid";
      }
      else {
        uVar5 = uVar5 / VVar6;
        local_38 = ptr + length;
        ptr_00 = ptr + uVar9 + VVar6;
        length_00 = length - (uVar9 + VVar6);
        do {
          uVar5 = uVar5 - 1;
          if (uVar5 == 0) {
            return;
          }
          if (local_38 <= ptr_00) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            msg = "Array value is out of bounds";
            goto LAB_001038f3;
          }
          validatePart(this,ptr_00,length_00,true);
          local_40 = ptr_00;
          VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &local_40);
          ptr_00 = ptr_00 + VVar6;
          length_00 = length_00 - VVar6;
        } while (VVar3 == VVar6);
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Unexpected Array value length";
      }
    }
    else {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array padding is invalid";
    }
  }
LAB_001038f3:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateUnindexedArray(uint8_t const* ptr, std::size_t length) {
  // Array without index table, with 1-8 bytes lengths, all values with same
  // length
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x02U);
  validateBufferLength(1 + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  // look up first member
  uint8_t const* p = ptr + 1 + byteSizeLength;
  uint8_t const* e = p + (8 - byteSizeLength);

  if (e > ptr + byteSize) {
    e = ptr + byteSize;
  }
  while (p < e && *p == '\x00') {
    ++p;
  }

  if (p >= ptr + byteSize) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array structure is invalid");
  }

  // check if padding is correct
  if (p != ptr + 1 + byteSizeLength &&
      p != ptr + 1 + byteSizeLength + (8 - byteSizeLength)) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array padding is invalid");
  }

  validatePart(p, length - (p - ptr), true);
  ValueLength itemSize = Slice(p).byteSize();
  if (itemSize == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array itemSize value is invalid");
  }
  ValueLength nrItems = (byteSize - (p - ptr)) / itemSize;

  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array nrItems value is invalid");
  }
  // we already validated p, so move it forward
  p += itemSize;
  e = ptr + length;
  --nrItems;

  while (nrItems > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array value is out of bounds");
    }
    // validate sub value
    validatePart(p, e - p, true);
    if (Slice(p).byteSize() != itemSize) {
      // got a sub-object with a different size. this is not allowed
      throw Exception(Exception::ValidatorInvalidLength,
                      "Unexpected Array value length");
    }
    p += itemSize;
    --nrItems;
  }
}